

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

SyntaxKind slang::syntax::SyntaxFacts::getBinarySequenceExpr(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 == 99) {
    return AndSequenceExpr;
  }
  if (iVar1 == 0xc9) {
    return IntersectSequenceExpr;
  }
  if (iVar1 == 0x151) {
    return WithinSequenceExpr;
  }
  if (iVar1 != 299) {
    if (iVar1 == 0xe6) {
      return OrSequenceExpr;
    }
    return Unknown;
  }
  return ThroughoutSequenceExpr;
}

Assistant:

SyntaxKind SyntaxFacts::getBinarySequenceExpr(TokenKind kind) {
    switch (kind) {
        case TokenKind::AndKeyword: return SyntaxKind::AndSequenceExpr;
        case TokenKind::OrKeyword: return SyntaxKind::OrSequenceExpr;
        case TokenKind::IntersectKeyword: return SyntaxKind::IntersectSequenceExpr;
        case TokenKind::ThroughoutKeyword: return SyntaxKind::ThroughoutSequenceExpr;
        case TokenKind::WithinKeyword: return SyntaxKind::WithinSequenceExpr;
        default: return SyntaxKind::Unknown;
    }
}